

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_hide_dialog_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object local_38;
  Am_Object window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object obj;
  Am_Object *cmd_local;
  
  obj.data = (Am_Object_Data *)cmd;
  Am_Object::Am_Object(&local_18);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)cmd);
  Am_Object::operator=(&local_18,(Am_Object *)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_38);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x68);
  Am_Object::operator=(&local_38,pAVar1);
  Am_Object::Set((ushort)&local_38,true,0);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_hide_dialog, (Am_Object cmd))
{
  Am_Object obj; // the cancel button
  obj = cmd.Get_Owner();
  Am_Object window;
  window = obj.Get(Am_WINDOW);
  window.Set(Am_VISIBLE, false);
}